

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O3

bool __thiscall CCoinsView::HaveCoin(CCoinsView *this,COutPoint *outpoint)

{
  int iVar1;
  long in_FS_OFFSET;
  CTxOut local_50;
  undefined4 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CTxOut::CTxOut(&local_50);
  local_28 = 0;
  iVar1 = (**this->_vptr_CCoinsView)(this,outpoint,&local_50);
  if (0x1c < local_50.scriptPubKey.super_CScriptBase._size) {
    free(local_50.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return SUB41(iVar1,0);
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsView::HaveCoin(const COutPoint &outpoint) const
{
    Coin coin;
    return GetCoin(outpoint, coin);
}